

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.h
# Opt level: O1

RecyclerTestObject * Location::Tag(RecyclerTestObject *untagged)

{
  byte bVar1;
  PageHeapData *pPVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined7 extraout_var;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  undefined4 *in_FS_OFFSET;
  
  if (untagged == (RecyclerTestObject *)0x0) {
    return (RecyclerTestObject *)0x0;
  }
  if (((ulong)untagged & 1) == 0) {
    return (RecyclerTestObject *)((ulong)untagged | 1);
  }
  Tag();
  uVar5 = (uint)((RecyclerHeapObjectInfo *)untagged)->m_heapBlock->heapBlockType;
  uVar7 = extraout_RDX;
  if ((uVar5 < 0xb) && ((0x528U >> (uVar5 & 0x1f) & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x8c2,"(!m_heapBlock->IsAnyFinalizableBlock())",
                       "!m_heapBlock->IsAnyFinalizableBlock()");
    if (!bVar4) goto LAB_001bb1da;
    *in_FS_OFFSET = 0;
    uVar7 = extraout_RDX_00;
  }
  if (((((RecyclerHeapObjectInfo *)untagged)->m_recycler->isPageHeapEnabled == true) &&
      (((RecyclerHeapObjectInfo *)untagged)->m_recycler->capturePageHeapFreeStack == true)) &&
     (((RecyclerHeapObjectInfo *)untagged)->isUsingLargeHeapBlock == true)) {
    pPVar2 = ((LargeHeapBlock *)((RecyclerHeapObjectInfo *)untagged)->m_heapBlock)->pageHeapData;
    if ((pPVar2 != (PageHeapData *)0x0) && (pPVar2->pageHeapMode != PageHeapModeOff)) {
      Memory::LargeHeapBlock::CapturePageHeapFreeStack
                ((LargeHeapBlock *)((RecyclerHeapObjectInfo *)untagged)->m_heapBlock);
      uVar7 = extraout_RDX_01;
    }
  }
  if (((RecyclerHeapObjectInfo *)untagged)->isUsingLargeHeapBlock == true) {
    bVar4 = Memory::RecyclerHeapObjectInfo::ClearImplicitRootBitsForLargeHeapBlock
                      ((RecyclerHeapObjectInfo *)untagged);
    return (RecyclerTestObject *)CONCAT71(extraout_var,bVar4);
  }
  if ((((RecyclerHeapObjectInfo *)untagged)->field_3).m_attributes == (byte *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x8db,"(m_attributes)","m_attributes");
    if (!bVar4) {
LAB_001bb1da:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *in_FS_OFFSET = 0;
    uVar7 = extraout_RDX_02;
  }
  bVar1 = *(((RecyclerHeapObjectInfo *)untagged)->field_3).m_attributes;
  uVar6 = CONCAT71((int7)((ulong)uVar7 >> 8),bVar1) & 0xffffff08;
  *(((RecyclerHeapObjectInfo *)untagged)->field_3).m_attributes = bVar1 & 0xf7;
  return (RecyclerTestObject *)CONCAT71((int7)(uVar6 >> 8),(byte)uVar6 >> 3);
}

Assistant:

static RecyclerTestObject * Tag(RecyclerTestObject * untagged)
    {
        if (untagged == nullptr)
        {
            return nullptr;
        }
        else
        {
            size_t value = (size_t)untagged;
            VerifyCondition((value & 0x1) == 0);
            value |= 0x1;
            return (RecyclerTestObject *)value;
        }
    }